

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O2

void separatetobefnz(global_State *g,int all)

{
  GCObject *pGVar1;
  GCObject *pGVar2;
  GCObject *pGVar3;
  
  pGVar1 = (GCObject *)&g->tobefnz;
  do {
    pGVar2 = pGVar1;
    pGVar1 = pGVar2->next;
  } while (pGVar1 != (GCObject *)0x0);
  pGVar1 = (GCObject *)&g->finobj;
  while (pGVar3 = pGVar1, pGVar1 = pGVar3->next, pGVar1 != (GCObject *)0x0) {
    if ((all != 0) || ((pGVar1->marked & 3) != 0)) {
      pGVar3->next = pGVar1->next;
      pGVar1->next = pGVar2->next;
      pGVar2->next = pGVar1;
      pGVar2 = pGVar1;
      pGVar1 = pGVar3;
    }
  }
  return;
}

Assistant:

static void separatetobefnz(global_State *g, int all) {
    GCObject *curr;
    GCObject **p = &g->finobj;
    GCObject **lastnext = findlast(&g->tobefnz);
    while ((curr = *p) != NULL) {  /* traverse all finalizable objects */
        lua_assert(tofinalize(curr));
        if (!(iswhite(curr) || all))  /* not being collected? */
            p = &curr->next;  /* don't bother with it */
        else {
            *p = curr->next;  /* remove 'curr' from 'finobj' list */
            curr->next = *lastnext;  /* link at the end of 'tobefnz' list */
            *lastnext = curr;
            lastnext = &curr->next;
        }
    }
}